

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  byte bVar11;
  stbtt__buf fontdict;
  float fVar12;
  stbtt_uint32 sVar13;
  ulong uVar14;
  int *piVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  uchar *puVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  long lVar31;
  uint uVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float dy2;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  stbtt__buf b;
  stbtt__buf sVar40;
  undefined1 in_stack_fffffffffffffda8 [12];
  int iVar41;
  stbtt__buf local_248;
  float local_238;
  int local_234;
  uchar *puVar42;
  ulong uVar43;
  float afStack_1d8 [2];
  stbtt_fontinfo *local_1d0;
  float s [48];
  stbtt__buf local_108;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  int *local_e0;
  stbtt__buf subr_stack [10];
  
  puVar42 = (info->subrs).data;
  local_108.cursor = (info->subrs).cursor;
  local_108.size = (info->subrs).size;
  local_248 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar19 = local_248._8_8_;
  uVar14 = uVar19 >> 0x20;
  if (local_248.size <= local_248.cursor) {
switchD_0017dd51_default:
    return 0;
  }
  local_108.data = puVar42;
  local_e0 = &(info->gsubrs).cursor;
  iVar41 = 1;
  uVar43 = 0;
  puVar42 = (uchar *)0x0;
  local_234 = 0;
  uVar20 = 0;
  local_1d0 = info;
LAB_0017d9a1:
  dy2 = s[9];
  fVar12 = s[8];
  fVar37 = s[7];
  fVar33 = s[6];
  fVar36 = s[5];
  fVar35 = s[4];
  fVar34 = s[2];
  iVar17 = (int)uVar19;
  uVar19 = (long)iVar17 + 1;
  iVar23 = (int)uVar19;
  local_248.cursor = iVar23;
  bVar11 = local_248.data[iVar17];
  uVar32 = (uint)uVar20;
  iVar30 = (int)uVar14;
  switch(bVar11) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    uVar43 = (ulong)(uint)((int)uVar43 + ((int)((int)(uVar20 >> 0x1f) + uVar32) >> 1));
    goto LAB_0017e066;
  case 2:
  case 9:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_0017d9ce_caseD_2:
    if (bVar11 < 0x20) {
      return 0;
    }
    if (bVar11 == 0xff) goto LAB_0017dada;
  case 0x1c:
    local_248.cursor = iVar17;
    if (iVar30 < iVar17) {
      local_248.cursor = iVar30;
    }
    if (iVar17 < 0) {
      local_248.cursor = iVar30;
    }
    sVar13 = stbtt__cff_int(&local_248);
    fVar34 = (float)(int)(short)sVar13;
LAB_0017db11:
    if (0x2f < (int)uVar32) {
      return 0;
    }
    s[(int)uVar32] = fVar34;
    uVar21 = (ulong)(uVar32 + 1);
    break;
  case 4:
    if ((int)uVar32 < 1) {
      return 0;
    }
    fVar34 = s[uVar32 - 1];
    fVar35 = 0.0;
    goto LAB_0017e02a;
  case 5:
    if ((int)uVar32 < 2) {
      return 0;
    }
    uVar14 = 1;
    do {
      uVar2 = c->x;
      uVar7 = c->y;
      fVar34 = (float)uVar2 + (float)*(undefined8 *)(s + (uVar14 - 1));
      fVar35 = (float)uVar7 + (float)((ulong)*(undefined8 *)(s + (uVar14 - 1)) >> 0x20);
      c->x = fVar34;
      c->y = fVar35;
      uVar21 = 0;
      stbtt__csctx_v(c,'\x02',(int)fVar34,(int)fVar35,0,0,0,0);
      uVar14 = uVar14 + 2;
    } while (uVar14 < uVar20);
    break;
  case 6:
    iVar30 = 0;
    if ((int)uVar32 < 1) {
      return 0;
    }
    for (; iVar30 < (int)uVar32; iVar30 = iVar30 + 1) {
      uVar4 = c->x;
      uVar9 = c->y;
      fVar34 = s[iVar30];
      c->x = fVar34 + (float)uVar4;
      c->y = (float)uVar9 + 0.0;
      stbtt__csctx_v(c,'\x02',(int)(fVar34 + (float)uVar4),(int)((float)uVar9 + 0.0),0,0,0,0);
      iVar30 = iVar30 + 1;
LAB_0017e59e:
      if ((int)uVar32 <= iVar30) break;
      uVar5 = c->x;
      uVar10 = c->y;
      fVar34 = s[iVar30];
      c->x = (float)uVar5 + 0.0;
      c->y = fVar34 + (float)uVar10;
      stbtt__csctx_v(c,'\x02',(int)((float)uVar5 + 0.0),(int)(fVar34 + (float)uVar10),0,0,0,0);
    }
    goto LAB_0017e066;
  case 7:
    iVar30 = 0;
    if (0 < (int)uVar32) goto LAB_0017e59e;
    return 0;
  case 8:
    if ((int)uVar32 < 6) {
      return 0;
    }
    uVar14 = 5;
    do {
      stbtt__csctx_rccurve_to
                (c,afStack_1d8[uVar14 - 1],afStack_1d8[uVar14],afStack_1d8[uVar14 + 1],s[uVar14 - 2]
                 ,s[uVar14 - 1],s[uVar14]);
      uVar14 = uVar14 + 6;
    } while (uVar14 < uVar20);
    uVar21 = 0;
    break;
  case 10:
    iVar30 = 1;
    if (local_234 == 0) {
      uVar16 = (local_1d0->fdselect).size;
      if (uVar16 != 0) {
        puVar24 = (local_1d0->fdselect).data;
        uVar18 = 0;
        if ((int)uVar16 < 0) {
          uVar18 = uVar16;
        }
        if ((int)uVar16 < 1) {
LAB_0017e302:
          uVar18 = uVar18 + glyph_index;
          uVar22 = uVar18;
          if ((int)uVar16 < (int)uVar18) {
            uVar22 = uVar16;
          }
          if ((int)uVar18 < 0) {
            uVar22 = uVar16;
          }
          uVar18 = 0;
          if ((int)uVar22 < (int)uVar16) {
            uVar18 = (uint)puVar24[(int)uVar22];
          }
        }
        else {
          if (puVar24[uVar18] == '\0') {
            uVar18 = 1;
            goto LAB_0017e302;
          }
          if (puVar24[uVar18] == '\x03') {
            uVar22 = 0;
            iVar23 = 1;
            iVar30 = 2;
            do {
              if (iVar23 < (int)uVar16) {
                lVar28 = (long)iVar23;
                iVar23 = iVar23 + 1;
                uVar18 = (uint)puVar24[lVar28];
              }
              else {
                uVar18 = 0;
              }
              uVar22 = uVar22 << 8 | uVar18;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
            uVar25 = 0;
            iVar30 = 2;
            do {
              if (iVar23 < (int)uVar16) {
                lVar28 = (long)iVar23;
                iVar23 = iVar23 + 1;
                uVar18 = (uint)puVar24[lVar28];
              }
              else {
                uVar18 = 0;
              }
              uVar25 = uVar25 << 8 | uVar18;
              iVar30 = iVar30 + -1;
            } while (iVar30 != 0);
            if (0 < (int)uVar22) {
              uVar26 = 0;
              do {
                if (iVar23 < (int)uVar16) {
                  lVar28 = (long)iVar23;
                  iVar23 = iVar23 + 1;
                  uVar18 = (uint)puVar24[lVar28];
                }
                else {
                  uVar18 = 0;
                }
                uVar27 = 0;
                iVar30 = 2;
                do {
                  if (iVar23 < (int)uVar16) {
                    lVar28 = (long)iVar23;
                    iVar23 = iVar23 + 1;
                    uVar29 = (uint)puVar24[lVar28];
                  }
                  else {
                    uVar29 = 0;
                  }
                  uVar27 = uVar27 << 8 | uVar29;
                  iVar30 = iVar30 + -1;
                } while (iVar30 != 0);
                if (glyph_index < (int)uVar27 && (int)uVar25 <= glyph_index) goto LAB_0017e31f;
                uVar26 = uVar26 + 1;
                uVar25 = uVar27;
              } while (uVar26 != uVar22);
            }
          }
          uVar18 = 0xffffffff;
        }
LAB_0017e31f:
        stbtt__cff_index_get(local_1d0->fontdicts,uVar18);
        sVar40.size = iVar41;
        sVar40.data = (uchar *)in_stack_fffffffffffffda8._0_8_;
        sVar40.cursor = in_stack_fffffffffffffda8._8_4_;
        fontdict.cursor = (int)uVar43;
        fontdict.size = (int)(uVar43 >> 0x20);
        fontdict.data = puVar42;
        local_108 = stbtt__get_subrs(sVar40,fontdict);
        iVar30 = 1;
      }
    }
    goto LAB_0017e36e;
  case 0xb:
    if ((int)puVar42 < 1) {
      return 0;
    }
    puVar42 = (uchar *)(ulong)((int)puVar42 - 1);
    local_248.data._4_4_ = *(undefined4 *)((long)&subr_stack[(long)puVar42].data + 4);
    local_248.data._0_4_ = *(undefined4 *)&subr_stack[(long)puVar42].data;
    local_248.cursor = subr_stack[(long)puVar42].cursor;
    local_248.size = subr_stack[(long)puVar42].size;
    uVar21 = uVar20;
    break;
  case 0xc:
    if (iVar30 <= iVar23) {
      return 0;
    }
    local_248.cursor = iVar17 + 2;
    switch(local_248.data[uVar19]) {
    case '\"':
      if ((int)uVar32 < 7) {
        return 0;
      }
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      dy2 = -fVar34;
      fVar37 = 0.0;
      fVar34 = 0.0;
      break;
    case '#':
      if ((int)uVar32 < 0xd) {
        return 0;
      }
      local_f8 = s[10];
      local_238 = s[0xb];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar35 = fVar33;
      fVar34 = local_238;
      fVar36 = fVar12;
      fVar33 = local_f8;
      break;
    case '$':
      if ((int)uVar32 < 9) {
        return 0;
      }
      local_f8 = s[1];
      uStack_f4 = 0;
      uStack_f0 = 0;
      uStack_ec = 0;
      local_238 = s[3];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      fVar35 = fVar36;
      dy2 = fVar37;
      fVar34 = -(local_f8 + local_238 + fVar37);
      fVar36 = fVar33;
      fVar37 = 0.0;
      fVar33 = fVar12;
      break;
    case '%':
      if ((int)uVar32 < 0xb) {
        return 0;
      }
      fVar34 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar36 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar35 = ABS(fVar34);
      fVar38 = ABS(fVar36);
      fVar39 = s[10];
      if (fVar35 <= fVar38) {
        fVar39 = -fVar34;
      }
      uVar32 = -(uint)(fVar38 < fVar35);
      uVar16 = ~uVar32 & (uint)s[10];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar35 = fVar33;
      fVar34 = (float)(uVar16 | (uint)-fVar36 & uVar32);
      fVar36 = fVar12;
      fVar33 = fVar39;
      break;
    default:
      goto switchD_0017dd51_default;
    }
    goto LAB_0017dd07;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (iVar41 != 0) {
      uVar43 = (ulong)(uint)((int)uVar43 + ((int)((int)(uVar20 >> 0x1f) + uVar32) >> 1));
    }
    iVar17 = (int)uVar43 + 7;
    iVar41 = (int)uVar43 + 0xe;
    if (-1 < iVar17) {
      iVar41 = iVar17;
    }
    iVar23 = (iVar41 >> 3) + iVar23;
    local_248.cursor = iVar23;
    if (iVar30 < iVar23) {
      local_248.cursor = iVar30;
    }
    if (iVar23 < 0) {
      local_248.cursor = iVar30;
    }
    goto LAB_0017e05e;
  case 0x15:
    if ((int)uVar32 < 2) {
      return 0;
    }
    fVar35 = s[uVar32 - 2];
    fVar34 = s[uVar32 - 1];
    goto LAB_0017e02a;
  case 0x16:
    if ((int)uVar32 < 1) {
      return 0;
    }
    fVar35 = s[uVar32 - 1];
    fVar34 = 0.0;
LAB_0017e02a:
    stbtt__csctx_rmove_to(c,fVar35,fVar34);
LAB_0017e05e:
    iVar41 = 0;
    goto LAB_0017e066;
  case 0x18:
    if ((int)uVar32 < 8) {
      return 0;
    }
    lVar28 = -6;
    do {
      lVar31 = lVar28;
      stbtt__csctx_rccurve_to
                (c,s[lVar31 + 6],s[lVar31 + 7],s[lVar31 + 8],s[lVar31 + 9],s[lVar31 + 10],
                 s[lVar31 + 0xb]);
      lVar28 = lVar31 + 6;
    } while (lVar31 + 6 < (long)(uVar20 - 0xd));
    if ((int)uVar32 <= (int)lVar31 + 0xd) {
      return 0;
    }
    uVar3 = c->x;
    uVar8 = c->y;
    fVar34 = (float)uVar3 + (float)*(undefined8 *)(s + lVar31 + 0xc);
    fVar35 = (float)uVar8 + (float)((ulong)*(undefined8 *)(s + lVar31 + 0xc) >> 0x20);
    c->x = fVar34;
    c->y = fVar35;
    stbtt__csctx_v(c,'\x02',(int)fVar34,(int)fVar35,0,0,0,0);
    uVar21 = 0;
    break;
  case 0x19:
    if ((int)uVar32 < 8) {
      return 0;
    }
    uVar14 = 2;
    do {
      uVar19 = uVar14;
      uVar1 = c->x;
      uVar6 = c->y;
      fVar34 = (float)uVar1 + (float)*(undefined8 *)(s + (uVar19 - 2));
      fVar35 = (float)uVar6 + (float)((ulong)*(undefined8 *)(s + (uVar19 - 2)) >> 0x20);
      c->x = fVar34;
      c->y = fVar35;
      stbtt__csctx_v(c,'\x02',(int)fVar34,(int)fVar35,0,0,0,0);
      uVar14 = uVar19 + 2;
    } while (uVar19 + 1 < (ulong)(uVar32 - 6));
    if ((int)uVar32 <= (int)(uVar19 + 5)) {
      return 0;
    }
    fVar35 = s[uVar19];
    dy2 = s[(int)uVar14 + 1];
    fVar34 = s[uVar19 + 5 & 0xffffffff];
    fVar36 = s[uVar14 & 0xffffffff];
    fVar37 = s[uVar19 + 1];
    fVar33 = s[(int)uVar14 + 2];
LAB_0017dd07:
    stbtt__csctx_rccurve_to(c,fVar35,fVar37,fVar36,dy2,fVar33,fVar34);
    goto LAB_0017e066;
  case 0x1a:
  case 0x1b:
    if ((int)uVar32 < 4) {
      return 0;
    }
    uVar14 = (ulong)(uVar32 & 1);
    if ((uVar32 & 1) + 3 < uVar32) {
      fVar34 = 0.0;
      if ((uVar20 & 1) != 0) {
        fVar34 = s[0];
      }
      do {
        iVar30 = (int)uVar14;
        fVar35 = s[uVar14];
        if (bVar11 == 0x1b) {
          fVar33 = fVar35;
          fVar37 = 0.0;
          fVar36 = s[iVar30 + 3];
          fVar35 = fVar34;
        }
        else {
          fVar36 = 0.0;
          fVar33 = fVar34;
          fVar37 = s[iVar30 + 3];
        }
        stbtt__csctx_rccurve_to(c,fVar33,fVar35,s[uVar14 + 1],s[uVar14 + 2],fVar36,fVar37);
        uVar14 = uVar14 + 4;
        fVar34 = 0.0;
      } while (iVar30 + 7 < (int)uVar32);
    }
    goto LAB_0017e066;
  case 0x1d:
    iVar30 = local_234;
LAB_0017e36e:
    if ((int)uVar32 < 1) {
      return 0;
    }
    iVar23 = (int)puVar42;
    if (9 < iVar23) {
      return 0;
    }
    fVar34 = s[uVar32 - 1];
    *(undefined4 *)&subr_stack[iVar23].data = local_248.data._0_4_;
    *(undefined4 *)((long)&subr_stack[iVar23].data + 4) = local_248.data._4_4_;
    subr_stack[iVar23].cursor = local_248.cursor;
    subr_stack[iVar23].size = local_248.size;
    piVar15 = &local_108.cursor;
    puVar24 = local_108.data;
    if (bVar11 != 10) {
      puVar24 = (local_1d0->gsubrs).data;
      piVar15 = local_e0;
    }
    puVar42 = (uchar *)(ulong)(iVar23 + 1);
    uVar18 = (uint)(*(ulong *)piVar15 >> 0x20);
    uVar22 = (int)uVar18 >> 0x1f & uVar18;
    uVar16 = 0;
    iVar23 = 2;
    do {
      if ((int)uVar22 < (int)uVar18) {
        lVar28 = (long)(int)uVar22;
        uVar22 = uVar22 + 1;
        uVar25 = (uint)puVar24[lVar28];
      }
      else {
        uVar25 = 0;
      }
      uVar16 = uVar16 << 8 | uVar25;
      iVar23 = iVar23 + -1;
    } while (iVar23 != 0);
    uVar18 = (uint)(0x4d7 < (int)uVar16) << 10 | 0x6b;
    if (0x846b < (int)uVar16) {
      uVar18 = 0x8000;
    }
    iVar23 = uVar18 + (int)fVar34;
    sVar40 = (stbtt__buf)ZEXT816(0);
    if (iVar23 < (int)uVar16 && -1 < iVar23) {
      b._8_8_ = (ulong)uVar22 | *(ulong *)piVar15 & 0xffffffff00000000;
      b.data = puVar24;
      sVar40 = stbtt__cff_index_get(b,iVar23);
    }
    if (sVar40._8_8_ >> 0x20 == 0) {
      return 0;
    }
    local_248.size = sVar40.size;
    local_248.data = sVar40.data;
    local_248.cursor = 0;
    uVar21 = (ulong)(uVar32 - 1);
    local_234 = iVar30;
    break;
  case 0x1e:
    iVar23 = 0;
    if ((int)uVar32 < 4) {
      return 0;
    }
    while (iVar23 + 3 < (int)uVar32) {
      iVar30 = iVar23 + 4;
      fVar34 = 0.0;
      if (uVar32 - iVar23 == 5) {
        fVar34 = s[iVar30];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar23],s[(long)iVar23 + 1],s[(long)iVar23 + 2],s[iVar23 + 3],fVar34);
LAB_0017e4f1:
      if ((int)uVar32 <= iVar30 + 3) break;
      iVar23 = iVar30 + 4;
      fVar34 = 0.0;
      if (uVar32 - iVar30 == 5) {
        fVar34 = s[iVar23];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar30],0.0,s[(long)iVar30 + 1],s[(long)iVar30 + 2],fVar34,s[iVar30 + 3]);
    }
LAB_0017e066:
    uVar21 = 0;
    break;
  case 0x1f:
    iVar30 = 0;
    if (3 < (int)uVar32) goto LAB_0017e4f1;
    return 0;
  default:
    if (bVar11 != 0xff) goto switchD_0017d9ce_caseD_2;
LAB_0017dada:
    uVar16 = 0;
    iVar23 = 4;
    do {
      iVar17 = (int)uVar19;
      if (iVar17 < iVar30) {
        uVar19 = (ulong)(iVar17 + 1);
        uVar18 = (uint)local_248.data[iVar17];
      }
      else {
        uVar18 = 0;
      }
      uVar16 = uVar16 << 8 | uVar18;
      iVar23 = iVar23 + -1;
    } while (iVar23 != 0);
    local_248.cursor = (int)uVar19;
    fVar34 = (float)(int)uVar16 * 1.5258789e-05;
    goto LAB_0017db11;
  }
  uVar19 = (ulong)(uint)local_248.cursor;
  uVar14 = (ulong)(uint)local_248.size;
  uVar20 = uVar21;
  if (local_248.size <= local_248.cursor) {
    return 0;
  }
  goto LAB_0017d9a1;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // fallthrough
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && (b0 < 32 || b0 > 254)) //-V560
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}